

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::mouseDoubleClickEvent(QLineEdit *this,QMouseEvent *e)

{
  uint uVar1;
  bool bVar2;
  MouseButton MVar3;
  int iVar4;
  QLineEditPrivate *this_00;
  qsizetype qVar5;
  int *piVar6;
  QPoint QVar7;
  QSinglePointEvent *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  int sizeChange;
  int textLength;
  bool positionOnPreedit;
  int preeditLength;
  int posInPreedit;
  QLineEditPrivate *d;
  int preeditPos;
  int position;
  QWidgetLineControl *in_stack_ffffffffffffff48;
  CursorPosition in_stack_ffffffffffffff50;
  int iVar8;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  int iVar9;
  int in_stack_ffffffffffffff7c;
  QLineEditPrivate *pQVar10;
  QString local_48;
  int local_2c;
  QPointF local_28;
  QPoint local_14;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QLineEdit *)0x5c65c5);
  MVar3 = QSinglePointEvent::button(in_RSI);
  if (MVar3 == LeftButton) {
    pQVar10 = this_00;
    local_28 = QSinglePointEvent::position((QSinglePointEvent *)0x5c65f1);
    local_14 = QPointF::toPoint(in_RDI);
    QPoint::x((QPoint *)0x5c6625);
    local_c = QLineEditPrivate::xToPos(this_00,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
    bVar2 = QWidgetLineControl::composeMode
                      ((QWidgetLineControl *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (bVar2) {
      local_2c = QWidgetLineControl::cursor((QWidgetLineControl *)pQVar10->control);
      iVar8 = local_c;
      in_stack_ffffffffffffff7c = QWidgetLineControl::cursor((QWidgetLineControl *)pQVar10->control)
      ;
      in_stack_ffffffffffffff7c = iVar8 - in_stack_ffffffffffffff7c;
      QWidgetLineControl::preeditAreaText(in_stack_ffffffffffffff48);
      qVar5 = QString::size(&local_48);
      iVar4 = (int)qVar5;
      QString::~QString((QString *)0x5c66c2);
      uVar1 = in_stack_ffffffffffffff74 & 0xffffff;
      if ((-1 < in_stack_ffffffffffffff7c) && (in_stack_ffffffffffffff7c <= iVar4)) {
        uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffff74);
      }
      in_stack_ffffffffffffff74 = uVar1;
      iVar9 = iVar4;
      in_stack_ffffffffffffff70 = QWidgetLineControl::end((QWidgetLineControl *)0x5c66f6);
      QWidgetLineControl::commitPreedit((QWidgetLineControl *)CONCAT44(iVar4,iVar8));
      in_stack_ffffffffffffff6c = QWidgetLineControl::end((QWidgetLineControl *)0x5c671c);
      in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c - in_stack_ffffffffffffff70;
      if ((in_stack_ffffffffffffff74 & 0x1000000) == 0) {
        if (local_2c < local_c) {
          local_c = (in_stack_ffffffffffffff6c - iVar9) + local_c;
        }
      }
      else if (in_stack_ffffffffffffff6c == 0) {
        local_c = -1;
      }
      else {
        piVar6 = qBound<int>((int *)in_RDI,(int *)this_00,(int *)CONCAT44(iVar4,iVar8));
        local_c = *piVar6;
      }
    }
    if (-1 < local_c) {
      QWidgetLineControl::selectWordAtPos
                ((QWidgetLineControl *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                 ,in_stack_ffffffffffffff6c);
    }
    QApplication::doubleClickInterval();
    QBasicTimer::start((QBasicTimer *)in_RDI,in_stack_ffffffffffffff7c,(QObject *)this_00);
    QSinglePointEvent::position((QSinglePointEvent *)0x5c67ed);
    QVar7 = QPointF::toPoint(in_RDI);
    pQVar10->tripleClick = QVar7;
  }
  else {
    QLineEditPrivate::sendMouseEventToInputContext
              (this_00,(QMouseEvent *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLineEdit::mouseDoubleClickEvent(QMouseEvent* e)
{
    Q_D(QLineEdit);

    if (e->button() == Qt::LeftButton) {
        int position = d->xToPos(e->position().toPoint().x());

        // exit composition mode
#ifndef QT_NO_IM
        if (d->control->composeMode()) {
            int preeditPos = d->control->cursor();
            int posInPreedit = position - d->control->cursor();
            int preeditLength = d->control->preeditAreaText().size();
            bool positionOnPreedit = false;

            if (posInPreedit >= 0 && posInPreedit <= preeditLength)
                positionOnPreedit = true;

            int textLength = d->control->end();
            d->control->commitPreedit();
            int sizeChange = d->control->end() - textLength;

            if (positionOnPreedit) {
                if (sizeChange == 0)
                    position = -1; // cancel selection, word disappeared
                else
                    // ensure not selecting after preedit if event happened there
                    position = qBound(preeditPos, position, preeditPos + sizeChange);
            } else if (position > preeditPos) {
                // adjust positions after former preedit by how much text changed
                position += (sizeChange - preeditLength);
            }
        }
#endif

        if (position >= 0)
            d->control->selectWordAtPos(position);

        d->tripleClickTimer.start(QApplication::doubleClickInterval(), this);
        d->tripleClick = e->position().toPoint();
    } else {
        d->sendMouseEventToInputContext(e);
    }
}